

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O1

double Util::JulianDateNatural2JD
                 (double year,double month,double day,double hour,double min,double sec)

{
  double dVar1;
  double dVar2;
  
  dVar1 = floor((month + 9.0) / 12.0);
  dVar2 = floor((month * 275.0) / 9.0);
  dVar1 = floor((dVar1 + year) * 7.0 * 0.25);
  return (year * 367.0 - dVar1) + dVar2 + day + 1721013.5 +
         ((sec / 60.0 + min) / 60.0 + hour) / 24.0;
}

Assistant:

double JulianDateNatural2JD(double year, double month, double day, double hour, double min, double sec){

		double term1 = 367.0*year;
		double term2 = floor((month + 9.0)/12.0);
		double term3 = floor(275.0*month/9.0);
		double term4 = ((sec/60.0 + min)/60.0 + hour)/24.0;

		double JD = term1 - floor(7.0*(year + term2)/4.0) + term3 + day + 1721013.5 + term4;

		return JD;
	}